

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void ParseCVarInfo(void)

{
  FGameConfigFile *this;
  bool bVar1;
  int iVar2;
  FBaseCVar *pFVar3;
  char *pcVar4;
  UCVarValue val;
  FBaseCVar *cvar;
  int cvarflags;
  ECVarType cvartype;
  char *cvardefault;
  FString cvarname;
  undefined1 local_118 [8];
  FScanner sc;
  int local_10;
  int iStack_c;
  bool addedcvars;
  int lastlump;
  int lump;
  
  local_10 = 0;
  sc.Escape = false;
  while (iStack_c = FWadCollection::FindLump(&Wads,"CVARINFO",&local_10,false), this = GameConfig,
        iStack_c != -1) {
    FScanner::FScanner((FScanner *)local_118,iStack_c);
    FScanner::SetCMode((FScanner *)local_118,true);
    while (bVar1 = FScanner::GetToken((FScanner *)local_118), bVar1) {
      FString::FString((FString *)&cvardefault);
      _cvarflags = (undefined1  [8])0x0;
      cvar._4_4_ = CVAR_Dummy;
      cvar._0_4_ = 0x2001;
      while (sc.String._4_4_ == 0x101) {
        iVar2 = strcasecmp((char *)local_118,"server");
        if (iVar2 == 0) {
          cvar._0_4_ = (uint)cvar | 4;
        }
        else {
          iVar2 = strcasecmp((char *)local_118,"user");
          if (iVar2 == 0) {
            cvar._0_4_ = (uint)cvar | 2;
          }
          else {
            iVar2 = strcasecmp((char *)local_118,"noarchive");
            if (iVar2 == 0) {
              cvar._0_4_ = (uint)cvar & 0xfffffffe;
            }
            else {
              FScanner::ScriptError((FScanner *)local_118,"Unknown cvar attribute \'%s\'",local_118)
              ;
            }
          }
        }
        FScanner::MustGetAnyToken((FScanner *)local_118);
      }
      if ((((uint)cvar & 6) == 0) || (((uint)cvar & 6) == 6)) {
        FScanner::ScriptError
                  ((FScanner *)local_118,"One of \'server\' or \'user\' must be specified");
      }
      if (sc.String._4_4_ == 0x132) {
        cvar._4_4_ = CVAR_Bool;
      }
      else if (sc.String._4_4_ == 0x13a) {
        cvar._4_4_ = CVAR_Int;
      }
      else if (sc.String._4_4_ == 0x133) {
        cvar._4_4_ = CVAR_Float;
      }
      else if (sc.String._4_4_ == 0x147) {
        cvar._4_4_ = CVAR_Color;
      }
      else if (sc.String._4_4_ == 0x144) {
        cvar._4_4_ = CVAR_String;
      }
      else {
        FScanner::ScriptError((FScanner *)local_118,"Bad cvar type \'%s\'",local_118);
      }
      FScanner::MustGetToken((FScanner *)local_118,0x101);
      pFVar3 = FindCVar((char *)local_118,(FBaseCVar **)0x0);
      if (pFVar3 != (FBaseCVar *)0x0) {
        FScanner::ScriptError((FScanner *)local_118,"cvar \'%s\' already exists",local_118);
      }
      FString::operator=((FString *)&cvardefault,(char *)local_118);
      bVar1 = FScanner::CheckToken((FScanner *)local_118,0x3d);
      if (bVar1) {
        if (cvar._4_4_ == CVAR_Bool) {
          bVar1 = FScanner::CheckToken((FScanner *)local_118,0x14b);
          _cvarflags = local_118;
          if ((!bVar1) &&
             (bVar1 = FScanner::CheckToken((FScanner *)local_118,0x14c), _cvarflags = local_118,
             !bVar1)) {
            FScanner::ScriptError((FScanner *)local_118,"Expected true or false");
            _cvarflags = local_118;
          }
        }
        else if (cvar._4_4_ == CVAR_Int) {
          FScanner::MustGetNumber((FScanner *)local_118);
          _cvarflags = local_118;
        }
        else if (cvar._4_4_ == CVAR_Float) {
          FScanner::MustGetFloat((FScanner *)local_118);
          _cvarflags = local_118;
        }
        else {
          FScanner::MustGetString((FScanner *)local_118);
          _cvarflags = local_118;
        }
      }
      pcVar4 = FString::operator_cast_to_char_((FString *)&cvardefault);
      pFVar3 = C_CreateCVar(pcVar4,cvar._4_4_,(uint)cvar);
      if (_cvarflags != (undefined1  [8])0x0) {
        (*pFVar3->_vptr_FBaseCVar[8])(pFVar3,_cvarflags,3);
      }
      FScanner::MustGetToken((FScanner *)local_118,0x3b);
      sc.Escape = true;
      FString::~FString((FString *)&cvardefault);
    }
    FScanner::~FScanner((FScanner *)local_118);
  }
  if ((sc.Escape & 1U) != 0) {
    pcVar4 = FString::operator_cast_to_char_(&gameinfo.ConfigName);
    FGameConfigFile::DoModSetup(this,pcVar4);
  }
  return;
}

Assistant:

void ParseCVarInfo()
{
	int lump, lastlump = 0;
	bool addedcvars = false;

	while ((lump = Wads.FindLump("CVARINFO", &lastlump)) != -1)
	{
		FScanner sc(lump);
		sc.SetCMode(true);

		while (sc.GetToken())
		{
			FString cvarname;
			char *cvardefault = NULL;
			ECVarType cvartype = CVAR_Dummy;
			int cvarflags = CVAR_MOD|CVAR_ARCHIVE;
			FBaseCVar *cvar;

			// Check for flag tokens.
			while (sc.TokenType == TK_Identifier)
			{
				if (stricmp(sc.String, "server") == 0)
				{
					cvarflags |= CVAR_SERVERINFO;
				}
				else if (stricmp(sc.String, "user") == 0)
				{
					cvarflags |= CVAR_USERINFO;
				}
				else if (stricmp(sc.String, "noarchive") == 0)
				{
					cvarflags &= ~CVAR_ARCHIVE;
				}
				else
				{
					sc.ScriptError("Unknown cvar attribute '%s'", sc.String);
				}
				sc.MustGetAnyToken();
			}
			// Do some sanity checks.
			if ((cvarflags & (CVAR_SERVERINFO|CVAR_USERINFO)) == 0 ||
				(cvarflags & (CVAR_SERVERINFO|CVAR_USERINFO)) == (CVAR_SERVERINFO|CVAR_USERINFO))
			{
				sc.ScriptError("One of 'server' or 'user' must be specified");
			}
			// The next token must be the cvar type.
			if (sc.TokenType == TK_Bool)
			{
				cvartype = CVAR_Bool;
			}
			else if (sc.TokenType == TK_Int)
			{
				cvartype = CVAR_Int;
			}
			else if (sc.TokenType == TK_Float)
			{
				cvartype = CVAR_Float;
			}
			else if (sc.TokenType == TK_Color)
			{
				cvartype = CVAR_Color;
			}
			else if (sc.TokenType == TK_String)
			{
				cvartype = CVAR_String;
			}
			else
			{
				sc.ScriptError("Bad cvar type '%s'", sc.String);
			}
			// The next token must be the cvar name.
			sc.MustGetToken(TK_Identifier);
			if (FindCVar(sc.String, NULL) != NULL)
			{
				sc.ScriptError("cvar '%s' already exists", sc.String);
			}
			cvarname = sc.String;
			// A default value is optional and signalled by a '=' token.
			if (sc.CheckToken('='))
			{
				switch (cvartype)
				{
				case CVAR_Bool:
					if (!sc.CheckToken(TK_True) && !sc.CheckToken(TK_False))
					{
						sc.ScriptError("Expected true or false");
					}
					cvardefault = sc.String;
					break;
				case CVAR_Int:
					sc.MustGetNumber();
					cvardefault = sc.String;
					break;
				case CVAR_Float:
					sc.MustGetFloat();
					cvardefault = sc.String;
					break;
				default:
					sc.MustGetString();
					cvardefault = sc.String;
					break;
				}
			}
			// Now create the cvar.
			cvar = C_CreateCVar(cvarname, cvartype, cvarflags);
			if (cvardefault != NULL)
			{
				UCVarValue val;
				val.String = cvardefault;
				cvar->SetGenericRepDefault(val, CVAR_String);
			}
			// To be like C and ACS, require a semicolon after everything.
			sc.MustGetToken(';');
			addedcvars = true;
		}
	}
	// Only load mod cvars from the config if we defined some, so we don't
	// clutter up the cvar space when not playing mods with custom cvars.
	if (addedcvars)
	{
		GameConfig->DoModSetup (gameinfo.ConfigName);
	}
}